

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sf::Image::flipVertically(Image *this)

{
  bool bVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t y;
  iterator bottom;
  iterator top;
  difference_type rowSize;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first1;
  ulong local_30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_18;
  ulong local_10;
  
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffffc0);
  if (!bVar1) {
    local_10 = (ulong)(uint)(*(int *)&(in_RDI->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_start << 2);
    local_18._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_RDI);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_RDI);
    local_20 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator-(in_stack_ffffffffffffffb8._M_current,in_stack_ffffffffffffffb0._M_current
                          );
    for (local_30 = 0;
        local_30 <
        *(uint *)((long)&(in_RDI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_start + 4) >> 1;
        local_30 = local_30 + 1) {
      __first1._M_current = local_18._M_current;
      __last1 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(in_stack_ffffffffffffffb8._M_current,
                            in_stack_ffffffffffffffb0._M_current);
      in_stack_ffffffffffffffb8._M_current = local_20._M_current;
      in_stack_ffffffffffffffb0 =
           std::
           swap_ranges<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                     (__first1,__last1,local_20);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&local_18,local_10);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator-=(&local_20,local_10);
    }
  }
  return;
}

Assistant:

void Image::flipVertically()
{
    if (!m_pixels.empty())
    {
        std::vector<Uint8>::iterator::difference_type rowSize = static_cast<std::vector<Uint8>::iterator::difference_type>(m_size.x * 4);

        std::vector<Uint8>::iterator top = m_pixels.begin();
        std::vector<Uint8>::iterator bottom = m_pixels.end() - rowSize;

        for (std::size_t y = 0; y < m_size.y / 2; ++y)
        {
            std::swap_ranges(top, top + rowSize, bottom);

            top += rowSize;
            bottom -= rowSize;
        }
    }
}